

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::preprocessor::preprocessor
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  iterator *piVar1;
  _Elt_pointer pcVar2;
  char *pcVar3;
  compile_error *this_00;
  int iVar4;
  _Elt_pointer __args;
  char cVar5;
  _Map_pointer ppcVar6;
  _Elt_pointer pcVar7;
  charset local_94;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  deque<char,std::allocator<char>> *local_80;
  string *local_78;
  string *local_70;
  context_t *local_68;
  compiler_type *local_60;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_58;
  string local_50;
  
  this->last_line_num = 1;
  this->line_num = 1;
  this->is_annotation = false;
  this->is_command = false;
  this->multi_line = false;
  this->empty_buff = true;
  this->empty_line = true;
  local_80 = (deque<char,std::allocator<char>> *)&this->buff;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  local_94 = encoding;
  local_68 = context;
  local_60 = compiler;
  local_58 = tokens;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
            ((_Deque_base<char,_std::allocator<char>_> *)local_80,0);
  local_70 = &this->command;
  local_88 = &(this->command).field_2;
  (this->command)._M_dataplus._M_p = (pointer)local_88;
  (this->command)._M_string_length = 0;
  (this->command).field_2._M_local_buf[0] = '\0';
  local_78 = &this->line;
  local_90 = &(this->line).field_2;
  (this->line)._M_dataplus._M_p = (pointer)local_90;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  __args = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (__args != pcVar2) {
    pcVar7 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppcVar6 = (char_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      cVar5 = *__args;
      iVar4 = (int)cVar5;
      if (iVar4 == 10) {
        process_endline(this,local_68,local_60,local_58,&local_94);
      }
      else if (this->is_annotation == false) {
        if (this->is_command == true) {
          iVar4 = isspace(iVar4);
          cVar5 = (char)local_70;
          if (iVar4 == 0) {
LAB_002a33c3:
            std::__cxx11::string::push_back(cVar5);
          }
        }
        else if ((this->empty_line == true) && (iVar4 = isspace(iVar4), iVar4 == 0)) {
          if (cVar5 == '@') {
            this->is_command = true;
          }
          else {
            if (cVar5 != '#') {
              this->empty_buff = false;
              this->empty_line = false;
              goto LAB_002a3378;
            }
            this->is_annotation = true;
          }
        }
        else {
LAB_002a3378:
          if (this->empty_buff == false) {
            pcVar3 = (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (pcVar3 == (this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>(local_80,__args);
            }
            else {
              *pcVar3 = *__args;
              piVar1 = &(this->buff).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            cVar5 = (char)local_78;
            goto LAB_002a33c3;
          }
        }
      }
      __args = __args + 1;
      if (__args == pcVar7) {
        __args = ppcVar6[1];
        ppcVar6 = ppcVar6 + 1;
        pcVar7 = __args + 0x200;
      }
    } while (__args != pcVar2);
  }
  process_endline(this,local_68,local_60,local_58,&local_94);
  if (this->multi_line == true) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Lack of the @end command.","");
    compile_error::compile_error(this_00,&local_50);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  return;
}

Assistant:

explicit preprocessor(const context_t &context, compiler_type &compiler, const std::deque<char> &char_buff,
		                      std::deque<token_base *> &tokens, charset encoding)
		{
			for (auto &ch: char_buff) {
				if (ch == '\n') {
					process_endline(context, compiler, tokens, encoding);
					continue;
				}
				if (is_annotation)
					continue;
				if (is_command) {
					if (!std::isspace(ch))
						command.push_back(ch);
					continue;
				}
				if (empty_line && !std::isspace(ch)) {
					switch (ch) {
					case '#':
						is_annotation = true;
						continue;
					case '@':
						is_command = true;
						continue;
					default:
						empty_buff = false;
						empty_line = false;
						break;
					}
				}
				if (!empty_buff) {
					buff.push_back(ch);
					line.push_back(ch);
				}
			}
			process_endline(context, compiler, tokens, encoding);
			if (multi_line)
				throw compile_error("Lack of the @end command.");
		}